

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tuple<testing::Matcher<pstore::address>,testing::Matcher<unsigned_long>,testing::Matcher<bool>,testing::Matcher<bool>>,std::tuple<pstore::address,unsigned_long,bool,bool>>
               (tuple<testing::Matcher<pstore::address>,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
                *matcher_tuple,tuple<pstore::address,_unsigned_long,_bool,_bool> *value_tuple)

{
  bool bVar1;
  
  bVar1 = MatcherBase<pstore::address>::Matches
                    ((MatcherBase<pstore::address> *)
                     &(matcher_tuple->
                      super__Tuple_impl<0UL,_testing::Matcher<pstore::address>,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
                      ).super__Head_base<0UL,_testing::Matcher<pstore::address>,_false>,
                     &(value_tuple->
                      super__Tuple_impl<0UL,_pstore::address,_unsigned_long,_bool,_bool>).
                      super__Head_base<0UL,_pstore::address,_false>._M_head_impl);
  if (bVar1) {
    bVar1 = MatcherBase<unsigned_long>::Matches
                      ((MatcherBase<unsigned_long> *)
                       &(matcher_tuple->
                        super__Tuple_impl<0UL,_testing::Matcher<pstore::address>,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
                        ).
                        super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
                        .super__Head_base<1UL,_testing::Matcher<unsigned_long>,_false>,
                       &(value_tuple->
                        super__Tuple_impl<0UL,_pstore::address,_unsigned_long,_bool,_bool>).
                        super__Tuple_impl<1UL,_unsigned_long,_bool,_bool>.
                        super__Head_base<1UL,_unsigned_long,_false>._M_head_impl);
    return bVar1;
  }
  return false;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple) &&
           std::get<N - 1>(matcher_tuple).Matches(std::get<N - 1>(value_tuple));
  }